

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeFabricVertexGetPropertiesExp
          (ze_fabric_vertex_handle_t hVertex,ze_fabric_vertex_exp_properties_t *pVertexProperties)

{
  ze_pfnFabricVertexGetPropertiesExp_t pfnGetPropertiesExp;
  dditable_t *dditable;
  ze_result_t result;
  ze_fabric_vertex_exp_properties_t *pVertexProperties_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  if (*(code **)(*(long *)(hVertex + 8) + 0x630) == (code *)0x0) {
    hVertex_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hVertex_local._4_4_ =
         (**(code **)(*(long *)(hVertex + 8) + 0x630))(*(undefined8 *)hVertex,pVertexProperties);
  }
  return hVertex_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetPropertiesExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex
        ze_fabric_vertex_exp_properties_t* pVertexProperties///< [in,out] query result for fabric vertex properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->dditable;
        auto pfnGetPropertiesExp = dditable->ze.FabricVertexExp.pfnGetPropertiesExp;
        if( nullptr == pfnGetPropertiesExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVertex = reinterpret_cast<ze_fabric_vertex_object_t*>( hVertex )->handle;

        // forward to device-driver
        result = pfnGetPropertiesExp( hVertex, pVertexProperties );

        return result;
    }